

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBoxPrivate::initHelper(QMessageBoxPrivate *this,QPlatformDialogHelper *h)

{
  long lVar1;
  QSharedPointer *in_RSI;
  Object *in_RDI;
  long in_FS_OFFSET;
  offset_in_QPlatformMessageDialogHelper_to_subr unaff_retaddr;
  ConnectionType in_stack_00000010;
  QPlatformMessageDialogHelper *messageDialogHelper;
  QSharedPointer *slot;
  Object *context;
  Object *in_stack_ffffffffffffffd0;
  Connection local_28;
  code *local_20;
  undefined8 uStack_18;
  Connection in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = helperClicked;
  uStack_18 = 0;
  slot = in_RSI;
  context = in_RDI;
  QObjectPrivate::
  connect<void(QPlatformMessageDialogHelper::*)(QPlatformDialogHelper::StandardButton,QPlatformDialogHelper::ButtonRole),void(QMessageBoxPrivate::*)(QPlatformDialogHelper::StandardButton,QPlatformDialogHelper::ButtonRole)>
            (in_stack_ffffffffffffffd0,unaff_retaddr,in_RDI,
             (Function)in_stack_fffffffffffffff0.d_ptr,(ConnectionType)((ulong)in_RSI >> 0x20));
  QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  QObject::
  connect<void(QPlatformMessageDialogHelper::*)(Qt::CheckState),QMessageBoxPrivate::initHelper(QPlatformDialogHelper*)::__0>
            ((Object *)in_RDI,
             (offset_in_QPlatformMessageDialogHelper_to_subr)in_stack_fffffffffffffff0.d_ptr,
             (ContextType *)context,(anon_class_8_1_8991fb9c_for_o *)slot,in_stack_00000010);
  QMetaObject::Connection::~Connection(&local_28);
  QPlatformMessageDialogHelper::setOptions(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBoxPrivate::initHelper(QPlatformDialogHelper *h)
{
    auto *messageDialogHelper = static_cast<QPlatformMessageDialogHelper *>(h);
    QObjectPrivate::connect(messageDialogHelper, &QPlatformMessageDialogHelper::clicked,
                            this, &QMessageBoxPrivate::helperClicked);
    // Forward state via lambda, so that we can handle addition and removal
    // of checkbox via setCheckBox() after initializing helper.
    QObject::connect(messageDialogHelper, &QPlatformMessageDialogHelper::checkBoxStateChanged,
        q_ptr, [this](Qt::CheckState state) {
            if (checkbox)
                checkbox->setCheckState(state);
        }
    );
    messageDialogHelper->setOptions(options);
}